

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O1

Vec4 __thiscall
deqp::gls::InteractionTestUtil::getRandomColor(InteractionTestUtil *this,Random *rnd)

{
  Vec4 VVar1;
  float val;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_40 = 0.0;
  de::Random::choose<float_const*,float*>
            (rnd,getRandomColor::components,(float *)&DAT_00686efc,&local_40,1);
  local_34 = local_40;
  local_40 = 0.0;
  de::Random::choose<float_const*,float*>
            (rnd,getRandomColor::components,(float *)&DAT_00686efc,&local_40,1);
  local_38 = local_40;
  local_40 = 0.0;
  de::Random::choose<float_const*,float*>
            (rnd,getRandomColor::components,(float *)&DAT_00686efc,&local_40,1);
  local_3c = local_40;
  local_40 = 0.0;
  de::Random::choose<float_const*,float*>
            (rnd,getRandomColor::components,(float *)&DAT_00686efc,&local_40,1);
  VVar1.m_data[1] = 0.0;
  VVar1.m_data[0] = local_40;
  *(float *)this = local_34;
  *(float *)(this + 4) = local_38;
  *(float *)(this + 8) = local_3c;
  *(float *)(this + 0xc) = local_40;
  VVar1.m_data[2] = local_3c;
  VVar1.m_data[3] = 0.0;
  return (Vec4)VVar1.m_data;
}

Assistant:

static Vec4 getRandomColor (de::Random& rnd)
{
	static const float components[] = { 0.0f, 0.2f, 0.4f, 0.5f, 0.6f, 0.8f, 1.0f };
	float r = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float g = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float b = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	float a = rnd.choose<float>(DE_ARRAY_BEGIN(components), DE_ARRAY_END(components));
	return Vec4(r, g, b, a);
}